

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param_bin(Net *this,char *protopath)

{
  int iVar1;
  FILE *__stream;
  
  __stream = fopen(protopath,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",protopath);
    iVar1 = -1;
  }
  else {
    iVar1 = load_param_bin(this,(FILE *)__stream);
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

int Net::load_param_bin(const char* protopath)
{
    FILE* fp = fopen(protopath, "rb");
    if (!fp)
    {
        fprintf(stderr, "fopen %s failed\n", protopath);
        return -1;
    }

    int ret = load_param_bin(fp);
    fclose(fp);
    return ret;
}